

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signature.hpp
# Opt level: O0

uint __thiscall
Kernel::Signature::addNumeralConstant<Kernel::RationalConstantType>
          (Signature *this,RationalConstantType *number_)

{
  bool bVar1;
  size_t sVar2;
  remove_reference_t<std::pair<Kernel::RationalConstantType,_unsigned_int>_&> *this_00;
  Symbol *key_00;
  Signature *in_RDI;
  Symbol *sym;
  RationalConstantType number;
  uint result;
  SymbolKey key;
  Symbol *in_stack_fffffffffffffe88;
  Stack<Kernel::Signature::Symbol_*> *in_stack_fffffffffffffe90;
  RationalConstantType *this_01;
  Map<Lib::Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>,_unsigned_int,_Lib::DefaultHash>
  *in_stack_fffffffffffffe98;
  RationalConstantType *in_stack_fffffffffffffec8;
  Signature *in_stack_fffffffffffffed0;
  pair<Kernel::RationalConstantType,_unsigned_int> *in_stack_fffffffffffffef8;
  Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>
  *in_stack_ffffffffffffff00;
  RationalConstantType local_d8;
  undefined4 local_b8;
  uint local_88;
  undefined4 local_74;
  uint local_4;
  
  local_74 = 0;
  std::make_pair<Kernel::RationalConstantType,unsigned_int>
            ((RationalConstantType *)in_stack_fffffffffffffe98,(uint *)in_stack_fffffffffffffe90);
  Lib::
  Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>
  ::Coproduct<std::pair<Kernel::RationalConstantType,_unsigned_int>,_0>
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  std::pair<Kernel::RationalConstantType,_unsigned_int>::~pair
            ((pair<Kernel::RationalConstantType,_unsigned_int> *)0x45c17a);
  Lib::
  Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>
  ::Coproduct((Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>
               *)in_stack_fffffffffffffe90,
              (Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>
               *)in_stack_fffffffffffffe88);
  bVar1 = Lib::
          Map<Lib::Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>,_unsigned_int,_Lib::DefaultHash>
          ::find(in_stack_fffffffffffffe98,
                 (Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>
                  *)in_stack_fffffffffffffe90,(uint *)in_stack_fffffffffffffe88);
  Lib::
  Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>
  ::~Coproduct((Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>
                *)0x45c1ce);
  if (bVar1) {
    local_4 = local_88;
    local_b8 = 1;
  }
  else {
    sVar2 = Lib::Stack<Kernel::Signature::Symbol_*>::length(&in_RDI->_funs);
    local_88 = (uint)sVar2;
    Lib::
    Coproduct<std::pair<std::__cxx11::string,unsigned_int>,std::__cxx11::string,std::pair<Kernel::IntegerConstantType,unsigned_int>,std::pair<Kernel::RationalConstantType,unsigned_int>,std::pair<Kernel::RealConstantType,unsigned_int>,std::pair<Kernel::Theory::Interpretation,Kernel::OperatorType*>>
    ::as<std::pair<Kernel::RationalConstantType,unsigned_int>>
              ((Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>
                *)in_stack_fffffffffffffe88);
    this_00 = Lib::Option<std::pair<Kernel::RationalConstantType,_unsigned_int>_&>::operator->
                        ((Option<std::pair<Kernel::RationalConstantType,_unsigned_int>_&> *)0x45c297
                        );
    RationalConstantType::RationalConstantType
              (&this_00->first,(RationalConstantType *)in_stack_fffffffffffffe98);
    noteOccurrence(in_RDI,&local_d8);
    RationalConstantType::RationalConstantType
              (&this_00->first,(RationalConstantType *)in_stack_fffffffffffffe98);
    key_00 = newNumeralConstantSymbol(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    RationalConstantType::~RationalConstantType((RationalConstantType *)in_stack_fffffffffffffe90);
    Lib::Stack<Kernel::Signature::Symbol_*>::push
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    this_01 = (RationalConstantType *)&in_RDI->_funNames;
    Lib::
    Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>
    ::Coproduct((Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>
                 *)this_01,
                (Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>
                 *)in_stack_fffffffffffffe88);
    Lib::
    Map<Lib::Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>,_unsigned_int,_Lib::DefaultHash>
    ::insert((Map<Lib::Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>,_unsigned_int,_Lib::DefaultHash>
              *)this_00,
             (Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>
              *)key_00,(uint)((ulong)this_01 >> 0x20));
    Lib::
    Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>
    ::~Coproduct((Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>
                  *)0x45c365);
    local_4 = local_88;
    local_b8 = 1;
    RationalConstantType::~RationalConstantType(this_01);
  }
  Lib::
  Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>
  ::~Coproduct((Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>
                *)0x45c3fd);
  return local_4;
}

Assistant:

unsigned addNumeralConstant(Numeral number_) {
    auto key = SymbolKey(std::make_pair(std::move(number_), unsigned(0)));
    unsigned result;
    if (_funNames.find(key,result)) {
      return result;
    }
    result = _funs.length();
    // copy number out of key again
    auto number = key.as<std::pair<Numeral, unsigned>>()->first;
    noteOccurrence(number);
    Symbol* sym = newNumeralConstantSymbol(std::move(number));
    _funs.push(sym);
    _funNames.insert(key,result);
    return result;
  }